

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmIOSettings::Write(ON_3dmIOSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  ON__INT32 local_28;
  bool local_21;
  int i;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_3dmIOSettings *this_local;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
  if (bVar1) {
    local_21 = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bSaveTextureBitmapsInFile & 1));
    if (local_21) {
      local_28 = this->m_idef_link_update;
      if ((local_28 == 0) && (iVar2 = ON_BinaryArchive::Archive3dmVersion(file), 4 < iVar2)) {
        local_28 = 1;
      }
      local_21 = ON_BinaryArchive::WriteInt(file,local_28);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      local_21 = false;
    }
    this_local._7_1_ = local_21;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_3dmIOSettings::Write(ON_BinaryArchive& file) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;
  for(;;)
  {
    rc = file.WriteBool(m_bSaveTextureBitmapsInFile);
    if(!rc) break;

    int i = m_idef_link_update;
    if ( 0 == i && file.Archive3dmVersion() >= 5 )
    {
      // 7 February 2011 - old 0 value is no longer an option.
      i = 1;
    }
    rc = file.WriteInt(i);
    if(!rc) break;

    break;
  }
  if ( !file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}